

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::LocationValidator::validateBuiltinVariable
          (LocationValidator *this,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  TestContext *this_00;
  undefined1 local_198 [16];
  TestLog local_188 [13];
  ios_base local_120 [264];
  
  local_198._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying location, expecting -1",0x20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_120);
  if (propValue != -1) {
    local_198._0_8_ = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tError, got ",0xc);
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_120);
    local_198._0_8_ = local_188;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"resource location invalid","");
    this_00 = (this->super_SingleVariableValidator).super_PropValidator.m_testCtx;
    if (this_00->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_198._0_8_);
    }
    if ((TestLog *)local_198._0_8_ != local_188) {
      operator_delete((void *)local_198._0_8_,(ulong)((long)&(local_188[0].m_log)->flags + 1));
    }
  }
  return;
}

Assistant:

void LocationValidator::validateBuiltinVariable (const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	// built-ins have no location

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying location, expecting -1" << tcu::TestLog::EndMessage;

	if (propValue != -1)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
		setError("resource location invalid");
	}
}